

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QRhiShaderStage,unsigned_int>::emplace_helper<unsigned_int_const&>
          (QHash<QRhiShaderStage,unsigned_int> *this,QRhiShaderStage *key,uint *args)

{
  byte bVar1;
  Entry *pEVar2;
  QShaderPrivate *pQVar3;
  ulong uVar4;
  piter pVar5;
  long lVar6;
  uint uVar7;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_>::
  findOrInsert<QRhiShaderStage>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> **)this,key);
  pEVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    uVar4 = (ulong)bVar1;
    lVar6 = uVar4 * 0x20;
    *(Type *)pEVar2[uVar4].storage.data = key->m_type;
    pQVar3 = (key->m_shader).d;
    (key->m_shader).d = (QShaderPrivate *)0x0;
    *(QShaderPrivate **)(pEVar2[uVar4].storage.data + 8) = pQVar3;
    *(Variant *)(pEVar2[uVar4].storage.data + 0x10) = key->m_shaderVariant;
    uVar7 = *args;
  }
  else {
    uVar7 = *args;
    lVar6 = (ulong)bVar1 << 5;
  }
  *(uint *)((pEVar2->storage).data + lVar6 + 0x18) = uVar7;
  pVar5.bucket = local_38._8_8_;
  pVar5.d = (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar5;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }